

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::Player(Player *this,Dice *d,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  Player(this);
  this->dice = d;
  this->playerID = i;
  Dice::setPlayerNumber(d,i);
  __val = -i;
  if (0 < i) {
    __val = i;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_00109f76;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_00109f76;
      }
      if (uVar2 < 10000) goto LAB_00109f76;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_00109f76:
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)(i >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)i >> 0x1f) + (long)local_68[0]),__len,__val);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Random ","");
  std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68[0]);
  std::__cxx11::string::_M_assign((string *)&this->playerName);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  this->ownedZone = 10;
  return;
}

Assistant:

Player::Player(Dice* d, int i): Player() {
    this ->dice = d ;
    this ->playerID = i;
    this ->dice->setPlayerNumber(i);
    this ->setPlayerName(std::string("Random ") += to_string(i));
    this ->setZone(10); // Nothing
}